

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O3

int rdacc_tmat(char *dir,float32 ****inout_tmat_acc,uint32 *inout_n_tmat,uint32 *inout_n_state_pm)

{
  uint32 d3;
  int iVar1;
  int iVar2;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***in_tmat_acc;
  char fn [4097];
  uint32 local_1038;
  uint32 local_1034;
  float32 ***local_1030;
  char local_1028 [4104];
  
  sprintf(local_1028,"%s/tmat_counts",dir);
  iVar1 = s3tmat_read(local_1028,&local_1030,&local_1034,&local_1038);
  iVar2 = -1;
  if (iVar1 != 0) {
    return -1;
  }
  if (*inout_tmat_acc == (float32 ***)0x0) {
    *inout_tmat_acc = local_1030;
    *inout_n_tmat = local_1034;
    *inout_n_state_pm = local_1038;
LAB_00107013:
    iVar2 = 0;
  }
  else {
    if (*inout_n_tmat == local_1034) {
      d3 = *inout_n_state_pm;
      if (d3 == local_1038) {
        accum_3d(*inout_tmat_acc,local_1030,local_1034,d3 - 1,d3);
        ckd_free_3d(local_1030);
        goto LAB_00107013;
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x60,"# tmat in, %u != prior # tmat, %u\n");
      if (*inout_n_state_pm == local_1038) {
        return -1;
      }
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
            ,0x65,"# tmat in, %u != prior # tmat, %u\n");
  }
  return iVar2;
}

Assistant:

int
rdacc_tmat(const char *dir,
           float32 **** inout_tmat_acc,
           uint32 * inout_n_tmat, uint32 * inout_n_state_pm)
{
    char fn[MAXPATHLEN + 1];
    float32 ***in_tmat_acc;
    float32 ***tmat_acc;
    uint32 n_tmat;
    uint32 n_state_pm;

    sprintf(fn, "%s/tmat_counts", dir);

    if (s3tmat_read(fn,
                    &in_tmat_acc,
                    &n_tmat, &n_state_pm) != S3_SUCCESS) {
        return S3_ERROR;
    }
    tmat_acc = *inout_tmat_acc;

    if (tmat_acc == NULL) {
        *inout_tmat_acc = tmat_acc = in_tmat_acc;
        *inout_n_tmat = n_tmat;
        *inout_n_state_pm = n_state_pm;
    }
    else {
        int err = FALSE;

        if (*inout_n_tmat != n_tmat) {
            E_ERROR("# tmat in, %u != prior # tmat, %u\n",
                    n_tmat, *inout_n_tmat);
            err = TRUE;
        }
        if (*inout_n_state_pm != n_state_pm) {
            E_ERROR("# tmat in, %u != prior # tmat, %u\n",
                    n_state_pm, *inout_n_state_pm);
            err = TRUE;
        }

        if (err)
            return S3_ERROR;

        accum_3d(tmat_acc, in_tmat_acc,
                 n_tmat, n_state_pm - 1, n_state_pm);

        ckd_free_3d((void ***) in_tmat_acc);
    }

    return S3_SUCCESS;
}